

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O1

void __thiscall
QArrayDataPointer<QPointer<QMdiSubWindow>_>::reallocateAndGrow
          (QArrayDataPointer<QPointer<QMdiSubWindow>_> *this,GrowthPosition where,qsizetype n,
          QArrayDataPointer<QPointer<QMdiSubWindow>_> *old)

{
  QArrayData *pQVar1;
  Data *pDVar2;
  Data *pDVar3;
  bool bVar4;
  QObject *pQVar5;
  QPointer<QMdiSubWindow> *pQVar6;
  QPointer<QMdiSubWindow> *pQVar7;
  qsizetype qVar8;
  long lVar9;
  long in_FS_OFFSET;
  undefined1 auVar10 [16];
  QArrayDataPointer<QPointer<QMdiSubWindow>_> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (old == (QArrayDataPointer<QPointer<QMdiSubWindow>_> *)0x0 && where == GrowsAtEnd) {
    pQVar1 = &this->d->super_QArrayData;
    if (pQVar1 == (QArrayData *)0x0) {
      bVar4 = true;
    }
    else {
      bVar4 = 1 < (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i;
    }
    if ((0 < n) && (!bVar4)) {
      if (pQVar1 == (QArrayData *)0x0) {
        qVar8 = 0;
        lVar9 = 0;
      }
      else {
        qVar8 = pQVar1->alloc;
        lVar9 = (this->size - pQVar1->alloc) +
                ((long)((long)this->ptr -
                       ((ulong)((long)&pQVar1[1].alloc + 7U) & 0xfffffffffffffff0)) >> 4);
      }
      auVar10 = QArrayData::reallocateUnaligned(pQVar1,this->ptr,0x10,qVar8 + n + lVar9,Grow);
      this->d = (Data *)auVar10._0_8_;
      this->ptr = (QPointer<QMdiSubWindow> *)auVar10._8_8_;
      goto LAB_0044ec04;
    }
  }
  local_38.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_38.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_38.ptr = (QPointer<QMdiSubWindow> *)&DAT_aaaaaaaaaaaaaaaa;
  allocateGrow(&local_38,this,n,where);
  if (this->size != 0) {
    lVar9 = this->size + (n >> 0x3f & n);
    if (this->d == (Data *)0x0) {
      bVar4 = true;
    }
    else {
      bVar4 = 1 < (this->d->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i;
    }
    pQVar6 = this->ptr;
    pQVar7 = pQVar6 + lVar9;
    if ((old != (QArrayDataPointer<QPointer<QMdiSubWindow>_> *)0x0) || (bVar4)) {
      if ((lVar9 != 0) && (0 < lVar9)) {
        do {
          pDVar2 = (pQVar6->wp).d;
          local_38.ptr[local_38.size].wp.d = pDVar2;
          local_38.ptr[local_38.size].wp.value = (pQVar6->wp).value;
          if (pDVar2 != (Data *)0x0) {
            LOCK();
            *(int *)pDVar2 = *(int *)pDVar2 + 1;
            UNLOCK();
          }
          pQVar6 = pQVar6 + 1;
          local_38.size = local_38.size + 1;
        } while (pQVar6 < pQVar7);
      }
    }
    else if ((lVar9 != 0) && (0 < lVar9)) {
      do {
        pQVar5 = (pQVar6->wp).value;
        local_38.ptr[local_38.size].wp.d = (pQVar6->wp).d;
        local_38.ptr[local_38.size].wp.value = pQVar5;
        (pQVar6->wp).d = (Data *)0x0;
        (pQVar6->wp).value = (QObject *)0x0;
        pQVar6 = pQVar6 + 1;
        local_38.size = local_38.size + 1;
      } while (pQVar6 < pQVar7);
    }
  }
  pDVar3 = this->d;
  pQVar6 = this->ptr;
  this->d = local_38.d;
  this->ptr = local_38.ptr;
  qVar8 = this->size;
  this->size = local_38.size;
  local_38.d = pDVar3;
  local_38.ptr = pQVar6;
  local_38.size = qVar8;
  if (old != (QArrayDataPointer<QPointer<QMdiSubWindow>_> *)0x0) {
    local_38.d = old->d;
    local_38.ptr = old->ptr;
    old->d = pDVar3;
    old->ptr = pQVar6;
    local_38.size = old->size;
    old->size = qVar8;
  }
  ~QArrayDataPointer(&local_38);
LAB_0044ec04:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

Q_NEVER_INLINE void reallocateAndGrow(QArrayData::GrowthPosition where, qsizetype n,
                                          QArrayDataPointer *old = nullptr)
    {
        if constexpr (QTypeInfo<T>::isRelocatable && alignof(T) <= alignof(std::max_align_t)) {
            if (where == QArrayData::GrowsAtEnd && !old && !needsDetach() && n > 0) {
                (*this)->reallocate(constAllocatedCapacity() - freeSpaceAtEnd() + n, QArrayData::Grow); // fast path
                return;
            }
        }

        QArrayDataPointer dp(allocateGrow(*this, n, where));
        if (n > 0)
            Q_CHECK_PTR(dp.data());
        if (where == QArrayData::GrowsAtBeginning) {
            Q_ASSERT(dp.freeSpaceAtBegin() >= n);
        } else {
            Q_ASSERT(dp.freeSpaceAtEnd() >= n);
        }
        if (size) {
            qsizetype toCopy = size;
            if (n < 0)
                toCopy += n;
            if (needsDetach() || old)
                dp->copyAppend(begin(), begin() + toCopy);
            else
                dp->moveAppend(begin(), begin() + toCopy);
            Q_ASSERT(dp.size == toCopy);
        }

        swap(dp);
        if (old)
            old->swap(dp);
    }